

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::RunContext::getCurrentTestName_abi_cxx11_(string *__return_storage_ptr__,RunContext *this)

{
  TestCaseInfo *pTVar1;
  RunContext *this_local;
  
  if (this->m_activeTestCase == (TestCase *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    pTVar1 = TestCase::getTestCaseInfo(this->m_activeTestCase);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pTVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string getCurrentTestName() const {
            return m_activeTestCase
                ? m_activeTestCase->getTestCaseInfo().name
                : std::string();
        }